

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void UnpackBoolVectorToFlatIndexList(ImBoolVector *in,ImVector<int> *out)

{
  int local_3c;
  int local_38;
  uint local_34;
  int bit_n;
  int entries_32;
  int *it;
  int *it_end;
  int *it_begin;
  ImVector<int> *out_local;
  ImBoolVector *in_local;
  
  it_begin = &out->Size;
  out_local = (ImVector<int> *)in;
  it_end = ImVector<int>::begin((ImVector<int> *)in);
  it = ImVector<int>::end(out_local);
  for (_bit_n = (uint *)it_end; _bit_n < it; _bit_n = _bit_n + 1) {
    local_34 = *_bit_n;
    if (local_34 != 0) {
      for (local_38 = 0; local_38 < 0x20; local_38 = local_38 + 1) {
        if ((local_34 & 1 << ((byte)local_38 & 0x1f)) != 0) {
          local_3c = (int)(((long)_bit_n - (long)it_end >> 2) << 5) + local_38;
          ImVector<int>::push_back((ImVector<int> *)it_begin,&local_3c);
        }
      }
    }
  }
  return;
}

Assistant:

static void UnpackBoolVectorToFlatIndexList(const ImBoolVector* in, ImVector<int>* out)
{
    IM_ASSERT(sizeof(in->Storage.Data[0]) == sizeof(int));
    const int* it_begin = in->Storage.begin();
    const int* it_end = in->Storage.end();
    for (const int* it = it_begin; it < it_end; it++)
        if (int entries_32 = *it)
            for (int bit_n = 0; bit_n < 32; bit_n++)
                if (entries_32 & (1u << bit_n))
                    out->push_back((int)((it - it_begin) << 5) + bit_n);
}